

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O1

double GetCostStat(uint litlen,uint dist,void *context)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if (dist != 0) {
    uVar2 = dist - 1;
    uVar3 = uVar2;
    if (4 < (int)dist) {
      uVar3 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = (uint)((uVar2 >> ((byte)(0x1e - (char)(uVar3 ^ 0x1f)) & 0x1f) & 1) != 0) +
              (uVar3 ^ 0x1f) * 2 ^ 0x3e;
    }
    uVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar4 = 0;
    if (4 < (int)dist) {
      iVar4 = (uVar1 ^ 0xffffffe0) + 0x1f;
    }
    return (double)(*(int *)(ZopfliGetLengthExtraBits_table + (long)(int)litlen * 4) + iVar4) +
           *(double *)
            ((long)context +
            (long)*(int *)(ZopfliGetLengthSymbol_table + (long)(int)litlen * 4) * 8 + 0xa00) +
           *(double *)((long)context + (long)(int)uVar3 * 8 + 0x1300);
  }
  return *(double *)((long)context + (ulong)litlen * 8 + 0xa00);
}

Assistant:

static double GetCostStat(unsigned litlen, unsigned dist, void* context) {
  SymbolStats* stats = (SymbolStats*)context;
  if (dist == 0) {
    return stats->ll_symbols[litlen];
  } else {
    int lsym = ZopfliGetLengthSymbol(litlen);
    int lbits = ZopfliGetLengthExtraBits(litlen);
    int dsym = ZopfliGetDistSymbol(dist);
    int dbits = ZopfliGetDistExtraBits(dist);
    return lbits + dbits + stats->ll_symbols[lsym] + stats->d_symbols[dsym];
  }
}